

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  long lVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImGuiWindow *pIVar6;
  void *pvVar7;
  ImGuiTable *table;
  void *pvVar8;
  long lVar9;
  bool bVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  uint uVar13;
  ImGuiContext *ctx;
  void *pvVar14;
  bool *pbVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ImVector<ImGuiListClipperRange> *this_00;
  long lVar21;
  int i;
  long lVar22;
  undefined8 *puVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ImGuiListClipperRange local_50;
  ImVector<ImGuiListClipperRange> *local_40;
  int local_34;
  
  pIVar11 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  pvVar7 = this->TempData;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  pIVar12 = GImGui;
  uVar13 = this->ItemsCount;
  if (uVar13 == 0) goto LAB_0010b46b;
  if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
    pbVar15 = &GImGui->CurrentWindow->SkipItems;
  }
  else {
    pbVar15 = &GImGui->CurrentTable->HostSkipItems;
  }
  if (*pbVar15 == true) goto LAB_0010b46b;
  iVar16 = *(int *)((long)pvVar7 + 0xc);
  if (iVar16 == 0 && table != (ImGuiTable *)0x0) {
    if (table->IsUnfrozenRows == false) {
      iVar16 = *(int *)((long)pvVar7 + 0x10);
      this->DisplayStart = iVar16;
      this->DisplayEnd = iVar16 + 1;
      if (iVar16 < (int)uVar13) {
        *(int *)((long)pvVar7 + 0x10) = iVar16 + 1;
        return true;
      }
      goto LAB_0010b46b;
    }
LAB_0010b4d6:
    this->StartPosY = (pIVar6->DC).CursorPos.y;
    if (this->ItemsHeight <= 0.0) {
      local_50.Max = *(int *)((long)pvVar7 + 0x10) + 1;
      local_50.Min = *(int *)((long)pvVar7 + 0x10);
      local_50.PosToIndexConvert = false;
      local_50.PosToIndexOffsetMin = '\0';
      local_50.PosToIndexOffsetMax = '\0';
      local_50._11_1_ = 0;
      ImVector<ImGuiListClipperRange>::push_front
                ((ImVector<ImGuiListClipperRange> *)((long)pvVar7 + 0x18),&local_50);
      piVar2 = *(int **)((long)pvVar7 + 0x20);
      iVar16 = *piVar2;
      iVar20 = *(int *)((long)pvVar7 + 0x10);
      if (*(int *)((long)pvVar7 + 0x10) < iVar16) {
        iVar20 = iVar16;
      }
      this->DisplayStart = iVar20;
      iVar16 = piVar2[1];
      iVar18 = this->ItemsCount;
      if (iVar16 < this->ItemsCount) {
        iVar18 = iVar16;
      }
      this->DisplayEnd = iVar18;
      if (iVar20 != iVar18) {
        *(undefined4 *)((long)pvVar7 + 0xc) = 1;
        return true;
      }
      goto LAB_0010b46b;
    }
    iVar20 = this->DisplayEnd;
    if (iVar16 == 0) goto LAB_0010b5c9;
LAB_0010b4fb:
    uVar13 = *(uint *)((long)pvVar7 + 0x18);
  }
  else {
    if (iVar16 == 0) goto LAB_0010b4d6;
    if (0.0 < this->ItemsHeight) {
      iVar20 = this->DisplayEnd;
      goto LAB_0010b4fb;
    }
    fVar3 = (pIVar6->DC).CursorPos.y;
    iVar20 = this->DisplayEnd;
    this->ItemsHeight = (fVar3 - this->StartPosY) / (float)(iVar20 - this->DisplayStart);
    if ((16777216.0 <= ABS(this->StartPosY)) || (16777216.0 <= ABS(fVar3))) {
      this->ItemsHeight = (pIVar6->DC).PrevLineSize.y + (pIVar11->Style).ItemSpacing.y;
    }
LAB_0010b5c9:
    if (pIVar11->LogEnabled == true) {
      lVar26 = (ulong)uVar13 << 0x20;
      iVar18 = *(int *)((long)pvVar7 + 0x18);
      if (iVar18 == *(int *)((long)pvVar7 + 0x1c)) {
        if (iVar18 == 0) {
          iVar16 = 8;
        }
        else {
          iVar16 = iVar18 / 2 + iVar18;
        }
        iVar24 = iVar18 + 1;
        if (iVar18 + 1 < iVar16) {
          iVar24 = iVar16;
        }
        piVar2 = &(pIVar12->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + 1;
        pvVar14 = (*GImAllocatorAllocFunc)((long)iVar24 * 0xc,GImAllocatorUserData);
        if (*(void **)((long)pvVar7 + 0x20) != (void *)0x0) {
          memcpy(pvVar14,*(void **)((long)pvVar7 + 0x20),(long)*(int *)((long)pvVar7 + 0x18) * 0xc);
          pvVar8 = *(void **)((long)pvVar7 + 0x20);
          if ((pvVar8 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar2 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar2 = *piVar2 + -1;
          }
          (*GImAllocatorFreeFunc)(pvVar8,GImAllocatorUserData);
        }
        *(void **)((long)pvVar7 + 0x20) = pvVar14;
        *(int *)((long)pvVar7 + 0x1c) = iVar24;
        iVar18 = *(int *)((long)pvVar7 + 0x18);
      }
      else {
        pvVar14 = *(void **)((long)pvVar7 + 0x20);
      }
      iVar16 = 0;
    }
    else {
      if (pIVar11->NavMoveScoringItems == true) {
        if ((pIVar11->NavWindow == (ImGuiWindow *)0x0) ||
           (pIVar11->NavWindow->RootWindowForNav != pIVar6->RootWindowForNav)) {
          bVar10 = false;
        }
        else {
          this_00 = (ImVector<ImGuiListClipperRange> *)((long)pvVar7 + 0x18);
          fVar3 = (pIVar11->NavScoringNoClipRect).Min.y;
          fVar4 = (pIVar11->NavScoringNoClipRect).Max.y;
          iVar16 = *(int *)((long)pvVar7 + 0x18);
          if (iVar16 == *(int *)((long)pvVar7 + 0x1c)) {
            if (iVar16 == 0) {
              iVar18 = 8;
            }
            else {
              iVar18 = iVar16 / 2 + iVar16;
            }
            local_34 = iVar16 + 1;
            if (iVar16 + 1 < iVar18) {
              local_34 = iVar18;
            }
            piVar2 = &(pIVar12->IO).MetricsActiveAllocations;
            *piVar2 = *piVar2 + 1;
            local_40 = this_00;
            pvVar14 = (*GImAllocatorAllocFunc)((long)local_34 * 0xc,GImAllocatorUserData);
            if (*(void **)((long)pvVar7 + 0x20) != (void *)0x0) {
              memcpy(pvVar14,*(void **)((long)pvVar7 + 0x20),
                     (long)*(int *)((long)pvVar7 + 0x18) * 0xc);
              pvVar8 = *(void **)((long)pvVar7 + 0x20);
              if ((pvVar8 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar2 = *piVar2 + -1;
              }
              (*GImAllocatorFreeFunc)(pvVar8,GImAllocatorUserData);
            }
            *(void **)((long)pvVar7 + 0x20) = pvVar14;
            *(int *)((long)pvVar7 + 0x1c) = local_34;
            iVar16 = *(int *)((long)pvVar7 + 0x18);
            this_00 = local_40;
          }
          else {
            pvVar14 = *(void **)((long)pvVar7 + 0x20);
          }
          *(ulong *)((long)pvVar14 + (long)iVar16 * 0xc) = CONCAT44((int)fVar4,(int)fVar3);
          *(undefined4 *)((long)pvVar14 + (long)iVar16 * 0xc + 8) = 1;
          this_00->Size = this_00->Size + 1;
          bVar10 = true;
          if (((pIVar11->NavMoveFlags & 0x400) != 0) &&
             (bVar10 = true, pIVar11->NavTabbingDir == -1)) {
            local_50.Min = this->ItemsCount + -1;
            local_50.Max = this->ItemsCount;
            local_50.PosToIndexConvert = false;
            local_50.PosToIndexOffsetMin = '\0';
            local_50.PosToIndexOffsetMax = '\0';
            local_50._11_1_ = 0;
            ImVector<ImGuiListClipperRange>::push_back(this_00,&local_50);
          }
        }
      }
      else {
        bVar10 = false;
      }
      if ((pIVar11->NavId != 0) && (pIVar6->NavLastIds[0] == pIVar11->NavId)) {
        fVar3 = (pIVar6->DC).CursorStartPos.y;
        local_50.Min = (int)(pIVar6->NavRectRel[0].Min.y + fVar3);
        local_50.Max = (int)(fVar3 + pIVar6->NavRectRel[0].Max.y);
        local_50.PosToIndexConvert = true;
        local_50.PosToIndexOffsetMin = '\0';
        local_50.PosToIndexOffsetMax = '\0';
        local_50._11_1_ = 0;
        ImVector<ImGuiListClipperRange>::push_back
                  ((ImVector<ImGuiListClipperRange> *)((long)pvVar7 + 0x18),&local_50);
      }
      iVar16 = 1;
      if (bVar10) {
        iVar16 = 0xff00;
        if (pIVar11->NavMoveClipDir != 2) {
          iVar16 = 0;
        }
        iVar16 = (uint)(pIVar11->NavMoveClipDir == 3) * 0x10000 + iVar16 + 1;
      }
      lVar26 = CONCAT44((int)(pIVar6->ClipRect).Max.y,(int)(pIVar6->ClipRect).Min.y);
      iVar18 = *(int *)((long)pvVar7 + 0x18);
      if (iVar18 == *(int *)((long)pvVar7 + 0x1c)) {
        if (iVar18 == 0) {
          iVar24 = 8;
        }
        else {
          iVar24 = iVar18 / 2 + iVar18;
        }
        local_40 = (ImVector<ImGuiListClipperRange> *)CONCAT44(local_40._4_4_,iVar16);
        iVar16 = iVar18 + 1;
        if (iVar18 + 1 < iVar24) {
          iVar16 = iVar24;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + 1;
        }
        pvVar14 = (*GImAllocatorAllocFunc)((long)iVar16 * 0xc,GImAllocatorUserData);
        if (*(void **)((long)pvVar7 + 0x20) != (void *)0x0) {
          memcpy(pvVar14,*(void **)((long)pvVar7 + 0x20),(long)*(int *)((long)pvVar7 + 0x18) * 0xc);
          pvVar8 = *(void **)((long)pvVar7 + 0x20);
          if ((pvVar8 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar2 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar2 = *piVar2 + -1;
          }
          (*GImAllocatorFreeFunc)(pvVar8,GImAllocatorUserData);
        }
        *(void **)((long)pvVar7 + 0x20) = pvVar14;
        *(int *)((long)pvVar7 + 0x1c) = iVar16;
        iVar18 = *(int *)((long)pvVar7 + 0x18);
        iVar16 = (int)local_40;
      }
      else {
        pvVar14 = *(void **)((long)pvVar7 + 0x20);
      }
    }
    *(long *)((long)pvVar14 + (long)iVar18 * 0xc) = lVar26;
    *(int *)((long)pvVar14 + (long)iVar18 * 0xc + 8) = iVar16;
    iVar16 = *(int *)((long)pvVar7 + 0x18);
    uVar13 = iVar16 + 1;
    *(uint *)((long)pvVar7 + 0x18) = uVar13;
    if (-1 < iVar16) {
      fVar3 = this->ItemsHeight;
      lVar26 = *(long *)((long)pvVar7 + 0x20);
      iVar16 = this->ItemsCount;
      lVar21 = 0;
      do {
        if (*(char *)(lVar26 + 8 + lVar21) == '\x01') {
          fVar4 = (pIVar6->DC).CursorPos.y;
          fVar5 = *(float *)((long)pvVar7 + 8);
          iVar24 = *(char *)(lVar26 + 9 + lVar21) + iVar20 +
                   (int)((((float)*(int *)(lVar26 + lVar21) - fVar4) - fVar5) / fVar3);
          iVar18 = iVar16 + -1;
          if (iVar24 < iVar16 + -1) {
            iVar18 = iVar24;
          }
          if (iVar24 < iVar20) {
            iVar18 = iVar20;
          }
          *(int *)(lVar26 + lVar21) = iVar18;
          iVar25 = *(char *)(lVar26 + 10 + lVar21) + iVar20 +
                   (int)((((float)*(int *)(lVar26 + 4 + lVar21) - fVar4) - fVar5) / fVar3 + 0.999999
                        );
          iVar24 = iVar16;
          if (iVar25 < iVar16) {
            iVar24 = iVar25;
          }
          if (iVar25 <= iVar18) {
            iVar24 = iVar18 + 1;
          }
          *(int *)(lVar26 + 4 + lVar21) = iVar24;
          *(undefined1 *)(lVar26 + 8 + lVar21) = 0;
        }
        lVar21 = lVar21 + 0xc;
      } while ((ulong)uVar13 * 0xc != lVar21);
    }
    iVar16 = *(int *)((long)pvVar7 + 0xc);
    if (1 < (int)(uVar13 - iVar16)) {
      lVar26 = (long)iVar16;
      uVar19 = (ulong)(uVar13 - iVar16);
      do {
        lVar21 = lVar26 * 0xc;
        lVar22 = lVar26;
        do {
          lVar9 = *(long *)((long)pvVar7 + 0x20);
          if (*(int *)(lVar9 + 0xc + lVar21) < *(int *)(lVar9 + lVar21)) {
            lVar1 = lVar9 + lVar21;
            puVar23 = (undefined8 *)(lVar9 + lVar21);
            local_50._8_4_ = *(undefined4 *)(puVar23 + 1);
            local_50._0_8_ = *puVar23;
            *(undefined4 *)(puVar23 + 1) = *(undefined4 *)(lVar1 + 0x14);
            *puVar23 = *(undefined8 *)(lVar1 + 0xc);
            *(undefined4 *)(lVar1 + 0x14) = local_50._8_4_;
            *(undefined8 *)(lVar1 + 0xc) = local_50._0_8_;
          }
          lVar22 = lVar22 + 1;
          lVar21 = lVar21 + 0xc;
        } while (lVar22 < (long)(uVar19 + lVar26 + -1));
        bVar10 = 2 < (long)uVar19;
        uVar19 = uVar19 - 1;
      } while (bVar10);
      uVar13 = *(uint *)((long)pvVar7 + 0x18);
      while (iVar18 = iVar16, iVar16 = iVar18 + 1, iVar16 < (int)uVar13) {
        lVar26 = *(long *)((long)pvVar7 + 0x20);
        iVar24 = *(int *)(lVar26 + 4 + (long)iVar18 * 0xc);
        uVar19 = (ulong)iVar16;
        iVar25 = *(int *)(lVar26 + uVar19 * 0xc);
        if (iVar25 <= iVar24) {
          piVar2 = (int *)(lVar26 + (long)iVar18 * 0xc);
          pvVar14 = (void *)(lVar26 + uVar19 * 0xc);
          if (*piVar2 < iVar25) {
            iVar25 = *piVar2;
          }
          *piVar2 = iVar25;
          iVar16 = *(int *)((long)pvVar14 + 4);
          if (*(int *)((long)pvVar14 + 4) < iVar24) {
            iVar16 = iVar24;
          }
          piVar2[1] = iVar16;
          memmove(pvVar14,(void *)((long)pvVar14 + 0xc),(~uVar19 + (long)(int)uVar13) * 0xc);
          uVar13 = *(int *)((long)pvVar7 + 0x18) - 1;
          *(uint *)((long)pvVar7 + 0x18) = uVar13;
          iVar16 = iVar18;
        }
      }
    }
  }
  iVar16 = *(int *)((long)pvVar7 + 0xc);
  if (iVar16 < (int)uVar13) {
    lVar26 = *(long *)((long)pvVar7 + 0x20);
    iVar18 = *(int *)(lVar26 + (long)iVar16 * 0xc);
    iVar24 = iVar20;
    if (iVar20 < iVar18) {
      iVar24 = iVar18;
    }
    this->DisplayStart = iVar24;
    iVar25 = *(int *)(lVar26 + 4 + (long)iVar16 * 0xc);
    iVar17 = this->ItemsCount;
    if (iVar25 < this->ItemsCount) {
      iVar17 = iVar25;
    }
    this->DisplayEnd = iVar17;
    if (iVar20 < iVar18) {
      ImGuiListClipper_SeekCursorForItem(this,iVar24);
      iVar16 = *(int *)((long)pvVar7 + 0xc);
    }
    *(int *)((long)pvVar7 + 0xc) = iVar16 + 1;
    return true;
  }
  if (this->ItemsCount != 0x7fffffff) {
    ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
  }
LAB_0010b46b:
  End(this);
  return false;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiListClipperData* data = (ImGuiListClipperData*)TempData;
    IM_ASSERT(data != NULL && "Called ImGuiListClipper::Step() too many times, or before ImGuiListClipper::Begin() ?");

    ImGuiTable* table = g.CurrentTable;
    if (table && table->IsInsideRow)
        ImGui::TableEndRow(table);

    // No items
    if (ItemsCount == 0 || GetSkipItemForListClipping())
        return (void)End(), false;

    // While we are in frozen row state, keep displaying items one by one, unclipped
    // FIXME: Could be stored as a table-agnostic state.
    if (data->StepNo == 0 && table != NULL && !table->IsUnfrozenRows)
    {
        DisplayStart = data->ItemsFrozen;
        DisplayEnd = data->ItemsFrozen + 1;
        if (DisplayStart >= ItemsCount)
            return (void)End(), false;
        data->ItemsFrozen++;
        return true;
    }

    // Step 0: Let you process the first element (regardless of it being visible or not, so we can measure the element height)
    bool calc_clipping = false;
    if (data->StepNo == 0)
    {
        StartPosY = window->DC.CursorPos.y;
        if (ItemsHeight <= 0.0f)
        {
            // Submit the first item (or range) so we can measure its height (generally the first range is 0..1)
            data->Ranges.push_front(ImGuiListClipperRange::FromIndices(data->ItemsFrozen, data->ItemsFrozen + 1));
            DisplayStart = ImMax(data->Ranges[0].Min, data->ItemsFrozen);
            DisplayEnd = ImMin(data->Ranges[0].Max, ItemsCount);
            if (DisplayStart == DisplayEnd)
                return (void)End(), false;
            data->StepNo = 1;
            return true;
        }
        calc_clipping = true;   // If on the first step with known item height, calculate clipping.
    }

    // Step 1: Let the clipper infer height from first range
    if (ItemsHeight <= 0.0f)
    {
        IM_ASSERT(data->StepNo == 1);
        if (table)
            IM_ASSERT(table->RowPosY1 == StartPosY && table->RowPosY2 == window->DC.CursorPos.y);

        ItemsHeight = (window->DC.CursorPos.y - StartPosY) / (float)(DisplayEnd - DisplayStart);
        bool affected_by_floating_point_precision = ImIsFloatAboveGuaranteedIntegerPrecision(StartPosY) || ImIsFloatAboveGuaranteedIntegerPrecision(window->DC.CursorPos.y);
        if (affected_by_floating_point_precision)
            ItemsHeight = window->DC.PrevLineSize.y + g.Style.ItemSpacing.y; // FIXME: Technically wouldn't allow multi-line entries.

        IM_ASSERT(ItemsHeight > 0.0f && "Unable to calculate item height! First item hasn't moved the cursor vertically!");
        calc_clipping = true;   // If item height had to be calculated, calculate clipping afterwards.
    }

    // Step 0 or 1: Calculate the actual ranges of visible elements.
    const int already_submitted = DisplayEnd;
    if (calc_clipping)
    {
        if (g.LogEnabled)
        {
            // If logging is active, do not perform any clipping
            data->Ranges.push_back(ImGuiListClipperRange::FromIndices(0, ItemsCount));
        }
        else
        {
            // Add range selected to be included for navigation
            const bool is_nav_request = (g.NavMoveScoringItems && g.NavWindow && g.NavWindow->RootWindowForNav == window->RootWindowForNav);
            if (is_nav_request)
                data->Ranges.push_back(ImGuiListClipperRange::FromPositions(g.NavScoringNoClipRect.Min.y, g.NavScoringNoClipRect.Max.y, 0, 0));
            if (is_nav_request && (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && g.NavTabbingDir == -1)
                data->Ranges.push_back(ImGuiListClipperRange::FromIndices(ItemsCount - 1, ItemsCount));

            // Add focused/active item
            ImRect nav_rect_abs = ImGui::WindowRectRelToAbs(window, window->NavRectRel[0]);
            if (g.NavId != 0 && window->NavLastIds[0] == g.NavId)
                data->Ranges.push_back(ImGuiListClipperRange::FromPositions(nav_rect_abs.Min.y, nav_rect_abs.Max.y, 0, 0));

            // Add visible range
            const int off_min = (is_nav_request && g.NavMoveClipDir == ImGuiDir_Up) ? -1 : 0;
            const int off_max = (is_nav_request && g.NavMoveClipDir == ImGuiDir_Down) ? 1 : 0;
            data->Ranges.push_back(ImGuiListClipperRange::FromPositions(window->ClipRect.Min.y, window->ClipRect.Max.y, off_min, off_max));
        }

        // Convert position ranges to item index ranges
        // - Very important: when a starting position is after our maximum item, we set Min to (ItemsCount - 1). This allows us to handle most forms of wrapping.
        // - Due to how Selectable extra padding they tend to be "unaligned" with exact unit in the item list,
        //   which with the flooring/ceiling tend to lead to 2 items instead of one being submitted.
        for (int i = 0; i < data->Ranges.Size; i++)
            if (data->Ranges[i].PosToIndexConvert)
            {
                int m1 = (int)(((double)data->Ranges[i].Min - window->DC.CursorPos.y - data->LossynessOffset) / ItemsHeight);
                int m2 = (int)((((double)data->Ranges[i].Max - window->DC.CursorPos.y - data->LossynessOffset) / ItemsHeight) + 0.999999f);
                data->Ranges[i].Min = ImClamp(already_submitted + m1 + data->Ranges[i].PosToIndexOffsetMin, already_submitted, ItemsCount - 1);
                data->Ranges[i].Max = ImClamp(already_submitted + m2 + data->Ranges[i].PosToIndexOffsetMax, data->Ranges[i].Min + 1, ItemsCount);
                data->Ranges[i].PosToIndexConvert = false;
            }
        ImGuiListClipper_SortAndFuseRanges(data->Ranges, data->StepNo);
    }

    // Step 0+ (if item height is given in advance) or 1+: Display the next range in line.
    if (data->StepNo < data->Ranges.Size)
    {
        DisplayStart = ImMax(data->Ranges[data->StepNo].Min, already_submitted);
        DisplayEnd = ImMin(data->Ranges[data->StepNo].Max, ItemsCount);
        if (DisplayStart > already_submitted) //-V1051
            ImGuiListClipper_SeekCursorForItem(this, DisplayStart);
        data->StepNo++;
        return true;
    }

    // After the last step: Let the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd),
    // Advance the cursor to the end of the list and then returns 'false' to end the loop.
    if (ItemsCount < INT_MAX)
        ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

    End();
    return false;
}